

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

string * __thiscall
slang::ast::GenerateBlockSymbol::getExternalName_abi_cxx11_(GenerateBlockSymbol *this)

{
  bool bVar1;
  Symbol *in_RSI;
  string *in_RDI;
  Scope *parent;
  Scope *in_stack_00000060;
  uint32_t in_stack_0000006c;
  allocator<char> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  Symbol *this_00;
  
  this_00 = in_RSI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RSI->name);
  if (bVar1) {
    Symbol::getParentScope(in_RSI);
    createGenBlkName_abi_cxx11_(in_stack_0000006c,in_stack_00000060);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  return in_RDI;
}

Assistant:

std::string GenerateBlockSymbol::getExternalName() const {
    if (!name.empty())
        return std::string(name);

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    return createGenBlkName(constructIndex, *parent);
}